

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

void __thiscall BuildStatus::BuildEdgeStarted(BuildStatus *this,Edge *edge)

{
  bool bVar1;
  int64_t iVar2;
  pair<const_Edge_*,_int> pVar3;
  pair<const_Edge_*,_int> local_40;
  int local_2c;
  iterator iStack_28;
  int start_time;
  _Self local_20;
  Edge *local_18;
  Edge *edge_local;
  BuildStatus *this_local;
  
  local_18 = edge;
  edge_local = (Edge *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_Edge_*,_int,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
       ::find(&this->running_edges_,&local_18);
  iStack_28 = std::
              map<const_Edge_*,_int,_std::less<const_Edge_*>,_std::allocator<std::pair<const_Edge_*const,_int>_>_>
              ::end(&this->running_edges_);
  bVar1 = std::operator==(&local_20,&stack0xffffffffffffffd8);
  if (bVar1) {
    iVar2 = GetTimeMillis();
    local_2c = (int)iVar2 - (int)this->start_time_millis_;
    pVar3 = std::make_pair<Edge_const*&,int&>(&local_18,&local_2c);
    local_40.first = pVar3.first;
    local_40.second = pVar3.second;
    std::map<Edge_const*,int,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
    ::insert<std::pair<Edge_const*,int>>
              ((map<Edge_const*,int,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                *)&this->running_edges_,&local_40);
    this->started_edges_ = this->started_edges_ + 1;
    bVar1 = Edge::use_console(local_18);
    if ((bVar1) || (bVar1 = LinePrinter::is_smart_terminal(&this->printer_), bVar1)) {
      PrintStatus(this,local_18,kEdgeStarted);
    }
    bVar1 = Edge::use_console(local_18);
    if (bVar1) {
      LinePrinter::SetConsoleLocked(&this->printer_,true);
    }
    return;
  }
  __assert_fail("running_edges_.find(edge) == running_edges_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                ,99,"void BuildStatus::BuildEdgeStarted(const Edge *)");
}

Assistant:

void BuildStatus::BuildEdgeStarted(const Edge* edge) {
  assert(running_edges_.find(edge) == running_edges_.end());
  int start_time = (int)(GetTimeMillis() - start_time_millis_);
  running_edges_.insert(make_pair(edge, start_time));
  ++started_edges_;

  if (edge->use_console() || printer_.is_smart_terminal())
    PrintStatus(edge, kEdgeStarted);

  if (edge->use_console())
    printer_.SetConsoleLocked(true);
}